

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzD::ArchiveOUT(ChNodeFEAxyzD *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChNodeFEAxyzD>(marchive);
  ChNodeFEAxyz::ArchiveOUT(&this->super_ChNodeFEAxyz,marchive);
  local_38._value = (ChVector<double> *)&(this->super_ChNodeFEAxyz).field_0xf0;
  local_38._name = "D";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->D_dt;
  local_38._name = "D_dt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->D_dtdt;
  local_38._name = "D_dtdt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChNodeFEAxyzD::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzD>();
    // serialize parent class
    ChNodeFEAxyz::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(D);
    marchive << CHNVP(D_dt);
    marchive << CHNVP(D_dtdt);
}